

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiTextIndex::clear(ImGuiTextIndex *this)

{
  int *piVar1;
  int *piVar2;
  
  piVar2 = (this->LineOffsets).Data;
  if (piVar2 != (int *)0x0) {
    (this->LineOffsets).Size = 0;
    (this->LineOffsets).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar2,GImAllocatorUserData);
    (this->LineOffsets).Data = (int *)0x0;
  }
  this->EndOffset = 0;
  return;
}

Assistant:

void            clear()                                 { LineOffsets.clear(); EndOffset = 0; }